

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterInstantiation
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  ostream *poVar4;
  allocator<char> *in_RSI;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
  *in_stack_ffffffffffffff58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  _Self local_58 [3];
  allocator<char> local_39;
  string local_38 [4];
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  GTestLogSeverity in_stack_ffffffffffffffdc;
  GTestLog *in_stack_ffffffffffffffe0;
  _Self local_18;
  allocator<char> *local_10;
  
  __s = &local_39;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffa0,(char *)__s,in_RSI);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x1fcd1a);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(&local_18,local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>
                           *)0x1fcd76);
    (ppVar2->second).instantiated = true;
  }
  else {
    GTestLog::GTestLog(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0
                       ,in_stack_ffffffffffffffcc);
    poVar3 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffa4);
    poVar3 = std::operator<<(poVar3,"Unknown type parameterized test suit \'");
    poVar4 = std::operator<<(poVar3,(char *)local_10);
    std::operator<<(poVar4,"\'");
    GTestLog::~GTestLog((GTestLog *)poVar3);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterInstantiation(
    const char* test_suite_name) {
  auto it = suites_.find(std::string(test_suite_name));
  if (it != suites_.end()) {
    it->second.instantiated = true;
  } else {
    GTEST_LOG_(ERROR) << "Unknown type parameterized test suit '"
                      << test_suite_name << "'";
  }
}